

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

TraceStats * __thiscall
perfetto::TracingServiceImpl::GetTraceStats
          (TraceStats *__return_storage_ptr__,TracingServiceImpl *this,
          TracingSession *tracing_session)

{
  _Rb_tree_header *p_Var1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ushort uVar5;
  ulong uVar6;
  _Head_base<0UL,_perfetto::protos::gen::TraceStats_FilterStats_*,_false> _Var7;
  bitset<5UL> bVar8;
  ushort *puVar9;
  long lVar10;
  pointer pTVar11;
  undefined4 uVar12;
  uint64_t uVar13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  ushort *puVar16;
  bool bVar17;
  
  protos::gen::TraceStats::TraceStats(__return_storage_ptr__);
  __return_storage_ptr__->producers_connected_ =
       (uint32_t)(this->producers_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  uVar6 = (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w;
  __return_storage_ptr__->producers_seen_ = (ulong)this->last_producer_id_;
  __return_storage_ptr__->data_sources_registered_ =
       (uint32_t)(this->data_sources_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __return_storage_ptr__->data_sources_seen_ = this->last_data_source_instance_id_;
  __return_storage_ptr__->tracing_sessions_ =
       (uint32_t)(this->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __return_storage_ptr__->total_buffers_ =
       (uint32_t)(this->buffers_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  uVar2 = this->patches_discarded_;
  __return_storage_ptr__->chunks_discarded_ = this->chunks_discarded_;
  __return_storage_ptr__->patches_discarded_ = uVar2;
  __return_storage_ptr__->invalid_packets_ = tracing_session->invalid_packets;
  uVar2 = tracing_session->flushes_succeeded;
  __return_storage_ptr__->flushes_requested_ = tracing_session->flushes_requested;
  __return_storage_ptr__->flushes_succeeded_ = uVar2;
  __return_storage_ptr__->flushes_failed_ = tracing_session->flushes_failed;
  __return_storage_ptr__->final_flush_outcome_ = tracing_session->final_flush_outcome;
  (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w = uVar6 | 0xf7fc;
  if ((tracing_session->trace_filter)._M_t.
      super___uniq_ptr_impl<protozero::MessageFilter,_std::default_delete<protozero::MessageFilter>_>
      ._M_t.
      super__Tuple_impl<0UL,_protozero::MessageFilter_*,_std::default_delete<protozero::MessageFilter>_>
      .super__Head_base<0UL,_protozero::MessageFilter_*,_false>._M_head_impl != (MessageFilter *)0x0
     ) {
    (__return_storage_ptr__->_has_field_).super__Base_bitset<1UL>._M_w = uVar6 | 0xfffc;
    _Var7._M_head_impl =
         (__return_storage_ptr__->filter_stats_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::TraceStats_FilterStats,_std::default_delete<perfetto::protos::gen::TraceStats_FilterStats>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::TraceStats_FilterStats_*,_std::default_delete<perfetto::protos::gen::TraceStats_FilterStats>_>
         .super__Head_base<0UL,_perfetto::protos::gen::TraceStats_FilterStats_*,_false>._M_head_impl
    ;
    bVar8.super__Base_bitset<1UL>._M_w = ((_Var7._M_head_impl)->_has_field_).super__Base_bitset<1UL>
    ;
    uVar13 = tracing_session->filter_input_packets;
    uVar12 = *(undefined4 *)((long)&tracing_session->filter_input_packets + 4);
    ((_Var7._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
         (_Base_bitset<1UL>)((ulong)bVar8.super__Base_bitset<1UL>._M_w | 2);
    uVar2 = tracing_session->filter_input_bytes;
    ((_Var7._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
         (_Base_bitset<1UL>)((ulong)bVar8.super__Base_bitset<1UL>._M_w | 6);
    uVar3 = tracing_session->filter_output_bytes;
    ((_Var7._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
         (_Base_bitset<1UL>)((ulong)bVar8.super__Base_bitset<1UL>._M_w | 0xe);
    uVar4 = tracing_session->filter_errors;
    *(int *)&(_Var7._M_head_impl)->input_packets_ = (int)uVar13;
    *(undefined4 *)((long)&(_Var7._M_head_impl)->input_packets_ + 4) = uVar12;
    *(int *)&(_Var7._M_head_impl)->input_bytes_ = (int)uVar2;
    *(int *)((long)&(_Var7._M_head_impl)->input_bytes_ + 4) = (int)(uVar2 >> 0x20);
    (_Var7._M_head_impl)->output_bytes_ = uVar3;
    (_Var7._M_head_impl)->errors_ = uVar4;
    ((_Var7._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
         (_Base_bitset<1UL>)((ulong)bVar8.super__Base_bitset<1UL>._M_w | 0x1e);
  }
  puVar16 = (tracing_session->buffers_index).
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar9 = (tracing_session->buffers_index).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar16 != puVar9) {
    p_Var1 = &(this->buffers_)._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var15 = (this->buffers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var15 != (_Base_ptr)0x0) {
        uVar5 = *puVar16;
        p_Var14 = &p_Var1->_M_header;
        do {
          bVar17 = (ushort)*(size_t *)(p_Var15 + 1) < uVar5;
          if (!bVar17) {
            p_Var14 = p_Var15;
          }
          p_Var15 = (&p_Var15->_M_left)[bVar17];
        } while (p_Var15 != (_Base_ptr)0x0);
        if ((((_Rb_tree_header *)p_Var14 != p_Var1) &&
            ((ushort)((_Rb_tree_header *)p_Var14)->_M_node_count <= uVar5)) &&
           (lVar10 = *(long *)((long)p_Var14 + 0x28), lVar10 != 0)) {
          std::
          vector<perfetto::protos::gen::TraceStats_BufferStats,_std::allocator<perfetto::protos::gen::TraceStats_BufferStats>_>
          ::emplace_back<>(&__return_storage_ptr__->buffer_stats_);
          pTVar11 = (__return_storage_ptr__->buffer_stats_).
                    super__Vector_base<perfetto::protos::gen::TraceStats_BufferStats,_std::allocator<perfetto::protos::gen::TraceStats_BufferStats>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          memcpy(&pTVar11[-1].buffer_size_,(void *)(lVar10 + 0xb8),0x98);
          ::std::__cxx11::string::_M_assign((string *)&pTVar11[-1].unknown_fields_);
          pTVar11[-1]._has_field_.super__Base_bitset<1UL>._M_w = *(_WordT *)(lVar10 + 0x170);
        }
      }
      puVar16 = puVar16 + 1;
    } while (puVar16 != puVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

TraceStats TracingServiceImpl::GetTraceStats(TracingSession* tracing_session) {
  TraceStats trace_stats;
  trace_stats.set_producers_connected(static_cast<uint32_t>(producers_.size()));
  trace_stats.set_producers_seen(last_producer_id_);
  trace_stats.set_data_sources_registered(
      static_cast<uint32_t>(data_sources_.size()));
  trace_stats.set_data_sources_seen(last_data_source_instance_id_);
  trace_stats.set_tracing_sessions(
      static_cast<uint32_t>(tracing_sessions_.size()));
  trace_stats.set_total_buffers(static_cast<uint32_t>(buffers_.size()));
  trace_stats.set_chunks_discarded(chunks_discarded_);
  trace_stats.set_patches_discarded(patches_discarded_);
  trace_stats.set_invalid_packets(tracing_session->invalid_packets);
  trace_stats.set_flushes_requested(tracing_session->flushes_requested);
  trace_stats.set_flushes_succeeded(tracing_session->flushes_succeeded);
  trace_stats.set_flushes_failed(tracing_session->flushes_failed);
  trace_stats.set_final_flush_outcome(tracing_session->final_flush_outcome);

  if (tracing_session->trace_filter) {
    auto* filt_stats = trace_stats.mutable_filter_stats();
    filt_stats->set_input_packets(tracing_session->filter_input_packets);
    filt_stats->set_input_bytes(tracing_session->filter_input_bytes);
    filt_stats->set_output_bytes(tracing_session->filter_output_bytes);
    filt_stats->set_errors(tracing_session->filter_errors);
  }

  for (BufferID buf_id : tracing_session->buffers_index) {
    TraceBuffer* buf = GetBufferByID(buf_id);
    if (!buf) {
      PERFETTO_DFATAL("Buffer not found.");
      continue;
    }
    *trace_stats.add_buffer_stats() = buf->stats();
  }  // for (buf in session).
  return trace_stats;
}